

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_suite1.cpp
# Opt level: O3

void test_suite1(fctkern_t *fctkern_ptr__)

{
  fct_clp_t *clp_00;
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  fctcl_t *clo;
  undefined8 *puVar4;
  long *plVar5;
  long lVar6;
  void *pvVar7;
  bool bVar8;
  FILE *__stream;
  int iVar9;
  int iVar10;
  ts_mode tVar11;
  fct_ts_t *pfVar12;
  void **ppvVar13;
  char *__s;
  char *option;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  fct_logger_i *itm;
  fct_test_t *pfVar17;
  char **ppcVar18;
  char *buffer_len;
  long lVar19;
  int iVar20;
  ulong uVar21;
  fct_clp_t *clp;
  char *err;
  undefined1 local_48 [16];
  
  pfVar12 = (fct_ts_t *)calloc(1,0x128);
  if (pfVar12 == (fct_ts_t *)0x0) {
    __assert_fail("ts != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x483
                  ,"fct_ts_t *fct_ts_new(const char *)");
  }
  strncpy(pfVar12->name,"test_suite1",0x100);
  pfVar12->name[0xff] = '\0';
  ppvVar13 = (void **)malloc(0x40);
  (pfVar12->test_list).itm_list = ppvVar13;
  if (ppvVar13 != (void **)0x0) {
    (pfVar12->test_list).avail_itm_num = 8;
  }
  (fctkern_ptr__->ns).ts_curr = pfVar12;
  if (fctkern_ptr__->cl_is_parsed != 0) goto LAB_00104c2c;
  if ((fctkern_ptr__->cl_user_opts == (fctcl_init_t *)0x0) ||
     (iVar9 = fct_clp__add_options(&fctkern_ptr__->cl_parser,fctkern_ptr__->cl_user_opts),
     iVar9 != 0)) {
    clp_00 = &fctkern_ptr__->cl_parser;
    iVar9 = fct_clp__add_options(clp_00,FCT_CLP_OPTIONS);
    if (iVar9 != 0) {
      iVar9 = fctkern_ptr__->cl_argc;
      ppcVar18 = fctkern_ptr__->cl_argv;
      (fctkern_ptr__->cl_parser).error_msg[0] = '\0';
      (fctkern_ptr__->cl_parser).is_error = 0;
      if (1 < iVar9) {
        pcVar16 = (fctkern_ptr__->cl_parser).error_msg;
        iVar20 = 1;
LAB_001047fa:
        __s = fctstr_clone(ppcVar18[iVar20]);
        option = strtok(__s,"=");
        pcVar14 = strtok((char *)0x0,"=");
        sVar3 = (fctkern_ptr__->cl_parser).clo_list.used_itm_num;
        bVar8 = true;
        if (sVar3 != 0) {
          uVar21 = 0;
          while( true ) {
            if ((fctkern_ptr__->cl_parser).clo_list.used_itm_num <= uVar21) goto LAB_00105045;
            clo = (fctcl_t *)(clp_00->clo_list).itm_list[uVar21];
            buffer_len = option;
            iVar10 = fctcl__is_option(clo,option);
            if (iVar10 != 0) break;
            uVar21 = uVar21 + 1;
            if (sVar3 == uVar21) goto code_r0x00104876;
          }
          if (clo->action == FCTCL_STORE_TRUE) {
            pcVar14 = "1";
          }
          else {
            if (clo->action != FCTCL_STORE_VALUE) goto LAB_001048ca;
            if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) goto LAB_001048c0;
            iVar20 = iVar20 + 1;
            if (iVar9 <= iVar20) {
              fct_snprintf(pcVar16,(size_t)buffer_len,"missing argument for %s",option);
              (fctkern_ptr__->cl_parser).is_error = 1;
              goto LAB_00105021;
            }
            pcVar14 = ppcVar18[iVar20];
          }
LAB_001048c0:
          pcVar14 = fctstr_clone(pcVar14);
          clo->value = pcVar14;
LAB_001048ca:
          bVar8 = false;
        }
        goto LAB_001048d1;
      }
      goto LAB_00104919;
    }
  }
LAB_001049d0:
  iVar9 = 0;
  iVar20 = 1;
LAB_00104bdb:
  sVar3 = (fctkern_ptr__->logger_list).used_itm_num;
  if (sVar3 != 0) {
    uVar21 = 0;
    do {
      if ((fctkern_ptr__->logger_list).used_itm_num <= uVar21) goto LAB_00105045;
      pvVar7 = (fctkern_ptr__->logger_list).itm_list[uVar21];
      *(fctkern_t **)((long)pvVar7 + 0x58) = fctkern_ptr__;
      (**(code **)((long)pvVar7 + 0x28))();
      uVar21 = uVar21 + 1;
    } while (sVar3 != uVar21);
  }
  if (iVar9 + 1U < 2) {
    fct_ts__del((fctkern_ptr__->ns).ts_curr);
    fctkern__final(fctkern_ptr__);
    exit(iVar20);
  }
  pfVar12 = (fctkern_ptr__->ns).ts_curr;
  if (pfVar12 == (fct_ts_t *)0x0) {
    fctkern__log_warn(fctkern_ptr__,"out of memory");
    return;
  }
LAB_00104c2c:
  sVar3 = (fctkern_ptr__->logger_list).used_itm_num;
  if (sVar3 != 0) {
    uVar21 = 0;
    do {
      if ((fctkern_ptr__->logger_list).used_itm_num <= uVar21) goto LAB_00105045;
      pvVar7 = (fctkern_ptr__->logger_list).itm_list[uVar21];
      *(fct_ts_t **)((long)pvVar7 + 0x70) = pfVar12;
      (**(code **)((long)pvVar7 + 0x18))();
      uVar21 = uVar21 + 1;
    } while (sVar3 != uVar21);
    pfVar12 = (fctkern_ptr__->ns).ts_curr;
  }
  do {
    while( true ) {
      tVar11 = pfVar12->mode;
      while (tVar11 == ts_mode_teardown) {
        tVar11 = (uint)(pfVar12->total_test_num <= pfVar12->curr_test_num) * 3 + ts_mode_setup;
        pfVar12->mode = tVar11;
      }
      if (tVar11 != ts_mode_setup) break;
      (fctkern_ptr__->ns).test_num = -1;
      pfVar12->mode = ts_mode_test;
      (fctkern_ptr__->ns).curr_test_name = "simple__one_is_one";
      (fctkern_ptr__->ns).test_num = 0;
LAB_00104cf4:
      iVar9 = fct_ts__is_test_cnt(pfVar12,0);
      pfVar12 = (fctkern_ptr__->ns).ts_curr;
      if (iVar9 == 0) goto LAB_00104da3;
      if (pfVar12->mode == ts_mode_end) goto LAB_001050f8;
      pfVar12->curr_test_num = pfVar12->curr_test_num + 1;
      iVar9 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
      if (iVar9 != 0) {
        pfVar17 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
        (fctkern_ptr__->ns).curr_test = pfVar17;
        if (pfVar17 == (fct_test_t *)0x0) {
LAB_00104e69:
          fctkern__log_warn(fctkern_ptr__,"out of memory");
          goto LAB_00104e78;
        }
        if (((fctkern_ptr__->ns).ts_is_skip_suite == 0) && ((fctkern_ptr__->ns).test_is_skip == 0))
        {
          fctkern__log_test_start(fctkern_ptr__,pfVar17);
          fct_test__start_timer((fctkern_ptr__->ns).curr_test);
          fct_xchk_test = (fctkern_ptr__->ns).curr_test;
          fct_xchk_lineno = 0x1b;
          pcVar16 = "1";
          goto LAB_00104f28;
        }
LAB_00104e1e:
        pfVar12 = (fctkern_ptr__->ns).ts_curr;
        if (pfVar12->mode == ts_mode_end) {
LAB_001050f8:
          __assert_fail("!((ts)->mode == ts_mode_end)",
                        "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                        ,0x49a,"void fct_ts__test_begin(fct_ts_t *)");
        }
        pfVar12->curr_test_num = pfVar12->curr_test_num + 1;
        ppcVar18 = &(fctkern_ptr__->ns).test_skip_cndtn;
        if ((fctkern_ptr__->ns).test_is_skip == 0) {
          ppcVar18 = &(fctkern_ptr__->ns).ts_skip_cndtn;
        }
        fctkern__log_test_skip(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name,*ppcVar18);
      }
LAB_00104e90:
      pfVar12 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar12 == (fct_ts_t *)0x0) {
        __assert_fail("ts != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x4ae,"void fct_ts__test_end(fct_ts_t *)");
      }
      pfVar12->mode = ts_mode_teardown;
    }
    if ((tVar11 == ts_mode_abort) || (tVar11 == ts_mode_ending)) {
      (fctkern_ptr__->ns).test_num = -1;
      pfVar12->mode = ts_mode_end;
      fct_nlist__append(&fctkern_ptr__->ts_list,pfVar12);
      pfVar12 = (fctkern_ptr__->ns).ts_curr;
      if (pfVar12 == (fct_ts_t *)0x0) {
        __assert_fail("ts != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x923,"void fctkern__log_suite_end(fctkern_t *, const fct_ts_t *)");
      }
      sVar3 = (fctkern_ptr__->logger_list).used_itm_num;
      if (sVar3 != 0) {
        uVar21 = 0;
        do {
          if ((fctkern_ptr__->logger_list).used_itm_num <= uVar21) {
LAB_00105045:
            __assert_fail("idx < list->used_itm_num",
                          "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h"
                          ,0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
          }
          pvVar7 = (fctkern_ptr__->logger_list).itm_list[uVar21];
          *(fct_ts_t **)((long)pvVar7 + 0x70) = pfVar12;
          (**(code **)((long)pvVar7 + 0x20))(pvVar7,(long)pvVar7 + 0x58);
          uVar21 = uVar21 + 1;
        } while (sVar3 != uVar21);
        pfVar12 = (fctkern_ptr__->ns).ts_curr;
      }
      pfVar12->mode = ts_mode_end;
      (fctkern_ptr__->ns).ts_curr = (fct_ts_t *)0x0;
      return;
    }
    (fctkern_ptr__->ns).curr_test_name = "simple__one_is_one";
    (fctkern_ptr__->ns).test_num = 0;
    if (tVar11 == ts_mode_test) goto LAB_00104cf4;
    if (tVar11 == ts_mode_cnt) {
      fct_ts__inc_total_test_num(pfVar12);
      pfVar12 = (fctkern_ptr__->ns).ts_curr;
    }
LAB_00104da3:
    (fctkern_ptr__->ns).curr_test_name = "simple__check_streq";
    iVar9 = (fctkern_ptr__->ns).test_num + 1;
    (fctkern_ptr__->ns).test_num = iVar9;
    if (pfVar12->mode == ts_mode_test) {
      iVar9 = fct_ts__is_test_cnt(pfVar12,iVar9);
      pfVar12 = (fctkern_ptr__->ns).ts_curr;
      if (iVar9 != 0) {
        if (pfVar12->mode == ts_mode_end) goto LAB_001050f8;
        pfVar12->curr_test_num = pfVar12->curr_test_num + 1;
        iVar9 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
        if (iVar9 != 0) {
          pfVar17 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
          (fctkern_ptr__->ns).curr_test = pfVar17;
          if (pfVar17 == (fct_test_t *)0x0) goto LAB_00104e69;
          if (((fctkern_ptr__->ns).ts_is_skip_suite != 0) || ((fctkern_ptr__->ns).test_is_skip != 0)
             ) goto LAB_00104e1e;
          fctkern__log_test_start(fctkern_ptr__,pfVar17);
          fct_test__start_timer((fctkern_ptr__->ns).curr_test);
          fct_xchk_test = (fctkern_ptr__->ns).curr_test;
          fct_xchk_lineno = 0x20;
          fct_xchk_file =
               "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O3/tests/test_multi_suite1.cpp"
          ;
          fct_xchk_kern = fctkern_ptr__;
          fct_xchk_fn(1,"streq(\"one\", \"one\")");
          fct_xchk_test = (fctkern_ptr__->ns).curr_test;
          fct_xchk_lineno = 0x21;
          pcVar16 = "!streq(\"one\", \"two\")";
LAB_00104f28:
          fct_xchk_file =
               "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O3/tests/test_multi_suite1.cpp"
          ;
          fct_xchk_kern = fctkern_ptr__;
          fct_xchk_fn(1,pcVar16);
          fct_test__stop_timer((fctkern_ptr__->ns).curr_test);
LAB_00104e78:
          fct_ts__add_test((fctkern_ptr__->ns).ts_curr,(fctkern_ptr__->ns).curr_test);
          fctkern__log_test_end(fctkern_ptr__,(fctkern_ptr__->ns).curr_test);
        }
        goto LAB_00104e90;
      }
    }
    else if (pfVar12->mode == ts_mode_cnt) {
      fct_ts__inc_total_test_num(pfVar12);
      pfVar12 = (fctkern_ptr__->ns).ts_curr;
    }
    if (pfVar12->mode == ts_mode_cnt) {
      pfVar12->mode = (uint)(pfVar12->total_test_num == 0) * 3 + ts_mode_setup;
    }
  } while( true );
code_r0x00104876:
  bVar8 = true;
LAB_001048d1:
  if ((fctkern_ptr__->cl_parser).is_error != 0) goto LAB_00105021;
  if (bVar8) {
    fct_nlist__append(&(fctkern_ptr__->cl_parser).param_list,__s);
  }
  else if (__s != (char *)0x0) {
    free(__s);
  }
  iVar20 = iVar20 + 1;
  if (iVar9 <= iVar20) goto code_r0x0010490c;
  goto LAB_001047fa;
code_r0x0010490c:
  if ((fctkern_ptr__->cl_parser).is_error != 0) {
LAB_00105021:
    fprintf(_stderr,"error: %s",pcVar16);
    goto LAB_001049d0;
  }
LAB_00104919:
  sVar3 = (fctkern_ptr__->cl_parser).param_list.used_itm_num;
  if (sVar3 != 0) {
    uVar21 = 0;
    do {
      if ((fctkern_ptr__->cl_parser).param_list.used_itm_num <= uVar21) goto LAB_00105045;
      pcVar16 = (char *)(fctkern_ptr__->cl_parser).param_list.itm_list[uVar21];
      if (pcVar16 == (char *)0x0) {
        __assert_fail("prefix_filter != __null && \"invalid arg\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x7de,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
      }
      sVar15 = strlen(pcVar16);
      if (sVar15 == 0) {
        __assert_fail("strlen(prefix_filter) > 0 && \"invalid arg\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x7df,"void fctkern__add_prefix_filter(fctkern_t *, const char *)");
      }
      pcVar14 = (char *)malloc(sVar15 + 1);
      fctstr_safe_cpy(pcVar14,pcVar16,sVar15 + 1);
      fct_nlist__append(&fctkern_ptr__->prefix_list,pcVar14);
      uVar21 = uVar21 + 1;
    } while (sVar3 != uVar21);
  }
  pcVar16 = fct_clp__optval2(clp_00,"--version",(char *)0x0);
  if (pcVar16 == (char *)0x0) {
    pcVar16 = fct_clp__optval2(clp_00,"--help",(char *)0x0);
    __stream = _stdout;
    if (pcVar16 == (char *)0x0) {
      pcVar16 = fct_clp__optval2(clp_00,"--logger","standard");
      if (pcVar16 == (char *)0x0) {
        __assert_fail("sel_logger != __null && \"should never be NULL\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x82f,"int fctkern__cl_parse_config_logger(fctkern_t *)");
      }
      if (fctkern_ptr__->lt_usr == (fct_logger_types_t *)0x0) {
        itm = (fct_logger_i *)0x0;
      }
      else {
        itm = fckern_sel_log(fctkern_ptr__->lt_usr,pcVar16);
      }
      if (itm == (fct_logger_i *)0x0 && fctkern_ptr__->lt_sys != (fct_logger_types_t *)0x0) {
        itm = fckern_sel_log(fctkern_ptr__->lt_sys,pcVar16);
      }
      if (itm == (fct_logger_i *)0x0) {
        fprintf(_stderr,"error: unknown logger selected - \'%s\'",pcVar16);
        goto LAB_001049c4;
      }
      fct_nlist__append(&fctkern_ptr__->logger_list,itm);
      fctkern_ptr__->cl_is_parsed = 1;
      iVar9 = 1;
    }
    else {
      fwrite("test.exe [options] prefix_filter ...\n\n",0x26,1,_stdout);
      sVar3 = (fctkern_ptr__->cl_parser).clo_list.used_itm_num;
      if (sVar3 != 0) {
        uVar21 = 0;
        do {
          if ((fctkern_ptr__->cl_parser).clo_list.used_itm_num <= uVar21) goto LAB_00105045;
          puVar4 = (undefined8 *)(clp_00->clo_list).itm_list[uVar21];
          if (puVar4[1] == 0) {
            fprintf(__stream,"%s\n",*puVar4);
          }
          else {
            fprintf(__stream,"%s, %s\n");
          }
          iVar9 = fctstr_ieq((char *)*puVar4,"--logger");
          if (iVar9 == 0) {
            fprintf(__stream,"  %s\n",puVar4[3]);
          }
          else {
            uVar1 = fctkern_ptr__->lt_usr;
            uVar2 = fctkern_ptr__->lt_sys;
            local_48._8_4_ = (int)uVar1;
            local_48._0_8_ = uVar2;
            local_48._12_4_ = (int)((ulong)uVar1 >> 0x20);
            fputs("  Sets the logger. The types of loggers currently available are,\n",__stream);
            lVar19 = 0;
            do {
              plVar5 = *(long **)(local_48 + lVar19 * 8);
              if (plVar5 != (long *)0x0) {
                lVar6 = *plVar5;
                while (lVar6 != 0) {
                  fprintf(__stream,"   =%s : %s\n",lVar6,plVar5[2]);
                  lVar6 = plVar5[3];
                  plVar5 = plVar5 + 3;
                }
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 != 2);
            fprintf(__stream,"  default is \'%s\'.\n","standard");
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != sVar3);
      }
      fputs("\n",__stream);
      iVar9 = -1;
    }
    iVar20 = 0;
  }
  else {
    printf("Built using FCTX version %s.\n");
LAB_001049c4:
    iVar20 = 0;
    iVar9 = -1;
  }
  goto LAB_00104bdb;
}

Assistant:

FCTMF_SUITE_BGN(test_suite1)
{
    FCT_TEST_BGN(simple__one_is_one)
    {
        fct_chk(1);
    }
    FCT_TEST_END();
    FCT_TEST_BGN(simple__check_streq)
    {
        fct_chk(streq("one", "one"));
        fct_chk(!streq("one", "two"));
    }
    FCT_TEST_END();
}